

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PP_COORD.cpp
# Opt level: O0

PP_COORD * __thiscall
PP_COORD::operator<=(PP_COORD *__return_storage_ptr__,PP_COORD *this,double *a)

{
  double *a_local;
  PP_COORD *this_local;
  PP_COORD *b;
  
  PP_COORD(__return_storage_ptr__);
  if (this->x <= *a) {
    __return_storage_ptr__->x = 1.0;
  }
  if (this->y <= *a) {
    __return_storage_ptr__->y = 1.0;
  }
  if (this->z <= *a) {
    __return_storage_ptr__->z = 1.0;
  }
  return __return_storage_ptr__;
}

Assistant:

PP_COORD PP_COORD::operator<= (double const& a)
{
    PP_COORD b;//init to the null vector
    if(x<=a) b.x=1.0;
    if(y<=a) b.y=1.0;
    if(z<=a) b.z=1.0;
    return b;
}